

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_in.c
# Opt level: O1

int GetDataBlock(gdIOCtx *fd,uchar *buf,int *ZeroDataBlockP)

{
  int iVar1;
  undefined8 in_RAX;
  uint uVar2;
  uchar count;
  byte local_21;
  
  local_21 = (byte)((ulong)in_RAX >> 0x38);
  iVar1 = gdGetBuf(&local_21,1,fd);
  uVar2 = 0xffffffff;
  if (0 < iVar1) {
    *ZeroDataBlockP = (uint)(local_21 == 0);
    if ((local_21 != 0) && (iVar1 = gdGetBuf(buf,(uint)local_21,fd), iVar1 < 1)) {
      return -1;
    }
    uVar2 = (uint)local_21;
  }
  return uVar2;
}

Assistant:

static int
GetDataBlock(gdIOCtx *fd, unsigned char *buf, int *ZeroDataBlockP)
{
	int rv, i;

	rv = GetDataBlock_(fd,buf, ZeroDataBlockP);

	if(VERBOSE) {
		printf("[GetDataBlock returning %d",rv);
		if(rv > 0) {
			printf(":");
			for(i = 0; i < rv; i++) {
				printf(" %02x",buf[i]);
			}
		}
		printf("]\n");
	}

	return rv;
}